

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.h
# Opt level: O0

void __thiscall google::protobuf::compiler::ruby::Generator::~Generator(Generator *this)

{
  Generator *this_local;
  
  ~Generator(this);
  operator_delete(this,8);
  return;
}

Assistant:

class PROTOC_EXPORT Generator : public CodeGenerator {
  bool Generate(const FileDescriptor* file, const std::string& parameter,
                GeneratorContext* generator_context,
                std::string* error) const override;
  uint64_t GetSupportedFeatures() const override {
    return Feature::FEATURE_PROTO3_OPTIONAL |
           Feature::FEATURE_SUPPORTS_EDITIONS;
  }
  Edition GetMinimumEdition() const override { return Edition::EDITION_PROTO2; }
  Edition GetMaximumEdition() const override { return Edition::EDITION_2023; }
}